

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O3

Fl_Menu_Item * __thiscall Fl_Menu_::find_item(Fl_Menu_ *this,Fl_Callback *cb)

{
  int iVar1;
  long lVar2;
  Fl_Menu_Item *this_00;
  long lVar3;
  long lVar4;
  
  this_00 = this->menu_;
  lVar3 = -1;
  lVar2 = -0x38;
  while( true ) {
    lVar4 = lVar2;
    if (this_00 == (Fl_Menu_Item *)0x0) {
      lVar2 = 0;
    }
    else {
      iVar1 = Fl_Menu_Item::size(this_00);
      lVar2 = (long)iVar1;
    }
    lVar3 = lVar3 + 1;
    if (lVar2 <= lVar3) break;
    this_00 = this->menu_;
    lVar2 = lVar4 + 0x38;
    if (*(Fl_Callback **)((long)&this_00[1].callback_ + lVar4) == cb) {
      return (Fl_Menu_Item *)((long)&this_00[1].text + lVar4);
    }
  }
  return (Fl_Menu_Item *)0x0;
}

Assistant:

const Fl_Menu_Item * Fl_Menu_::find_item(Fl_Callback *cb) {
  for ( int t=0; t < size(); t++ ) {
    const Fl_Menu_Item *m = menu_ + t;
    if (m->callback_==cb) {
      return m;
    }
  }
  return (const Fl_Menu_Item *)0;
}